

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O2

bool __thiscall wabt::WastParser::ParseElemExprOpt(WastParser *this,ExprList *out_elem_expr)

{
  bool bVar1;
  Result RVar2;
  TokenTypePair pair;
  ExprList exprs;
  
  bVar1 = MatchLpar(this,Item);
  exprs.first_ = (Expr *)0x0;
  exprs.last_ = (Expr *)0x0;
  exprs.size_ = 0;
  if (bVar1) {
    RVar2 = ParseTerminatingInstrList(this,&exprs);
    if (RVar2.enum_ == Ok) {
      RVar2 = Expect(this,Rpar);
      bVar1 = true;
      if (RVar2.enum_ == Error) goto LAB_0012ca64;
      if (exprs.size_ != 0) goto LAB_0012ca52;
    }
  }
  else {
    pair = PeekPair(this);
    bVar1 = anon_unknown_1::IsExpr(pair);
    if (bVar1) {
      RVar2 = ParseExpr(this,&exprs);
      bVar1 = false;
      if ((RVar2.enum_ != Ok) || (exprs.size_ == 0)) goto LAB_0012ca64;
LAB_0012ca52:
      intrusive_list<wabt::Expr>::operator=(out_elem_expr,&exprs);
      bVar1 = true;
      goto LAB_0012ca64;
    }
  }
  bVar1 = false;
LAB_0012ca64:
  intrusive_list<wabt::Expr>::clear(&exprs);
  return bVar1;
}

Assistant:

bool WastParser::ParseElemExprOpt(ExprList* out_elem_expr) {
  WABT_TRACE(ParseElemExprOpt);
  bool item = MatchLpar(TokenType::Item);
  ExprList exprs;
  if (item) {
    if (ParseTerminatingInstrList(&exprs) != Result::Ok) {
      return false;
    }
    EXPECT(Rpar);
  } else {
    if (!IsExpr(PeekPair()) || ParseExpr(&exprs) != Result::Ok) {
      return false;
    }
  }
  if (!exprs.size()) {
    return false;
  }
  *out_elem_expr = std::move(exprs);
  return true;
}